

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projector.h
# Opt level: O0

void __thiscall Projector::LoadSlice(Projector *this,string *imageLoc,ofstream *myFile)

{
  ostream *poVar1;
  ostream *in_RDX;
  string *in_RSI;
  type *in_RDI;
  thread t_display;
  string *__args;
  string local_78 [96];
  ostream *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),in_RSI);
  __args = local_78;
  cv::imread(__args,(int)in_RSI);
  cv::Mat::operator=((Mat *)(in_RDI + 5),(Mat *)__args);
  cv::Mat::~Mat((Mat *)local_78);
  std::thread::thread<void(Projector::*)(),Projector*,void>
            ((thread *)DisplayCurrentSlice,in_RDI,(Projector **)__args);
  std::thread::detach();
  if (in_RDI[7] == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"No Image data!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(local_18,"No Image data!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"New Image loaded");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(local_18,"New Image loaded");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::thread::~thread((thread *)0x10bc12);
  return;
}

Assistant:

void Projector::LoadSlice(string imageLoc, ofstream &myFile)
{

	CurrentImageLoc = imageLoc;
	CurrentImage = imread(imageLoc, 1);

	//Display image in seperate thread
	thread t_display(&Projector::DisplayCurrentSlice, this);
	t_display.detach();

	if (!CurrentImage.data)
	{
		cout << "No Image data!" << endl;
		myFile << "No Image data!" << endl;

	}
	else
	{
		cout << "New Image loaded" << endl;
		myFile << "New Image loaded" << endl;
	}


}